

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  key_type kVar2;
  key_type kVar3;
  key_type kVar4;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertionResult *assertion_result;
  char *actual_predicate_value;
  char *expected_predicate_value;
  AssertHelper *this_01;
  char *pcVar5;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb88;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *success;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb90;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  uint *in_stack_ffffffffffffeb98;
  int iVar6;
  uint *lhs;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeba0;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  undefined4 in_stack_ffffffffffffeba8;
  int in_stack_ffffffffffffebac;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *this_04;
  undefined4 in_stack_ffffffffffffebb0;
  undefined4 in_stack_ffffffffffffebb4;
  undefined4 in_stack_ffffffffffffebb8;
  Type in_stack_ffffffffffffebbc;
  AssertHelper *in_stack_ffffffffffffebc0;
  undefined4 in_stack_ffffffffffffebc8;
  undefined4 in_stack_ffffffffffffebcc;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffebd0;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_05;
  char *in_stack_ffffffffffffebf0;
  char *in_stack_ffffffffffffebf8;
  undefined4 in_stack_ffffffffffffec00;
  undefined4 in_stack_ffffffffffffec04;
  AssertionResult *in_stack_ffffffffffffec08;
  undefined4 in_stack_ffffffffffffec10;
  undefined4 in_stack_ffffffffffffec14;
  key_type *in_stack_ffffffffffffec58;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffec60;
  string local_11d0 [55];
  undefined1 local_1199;
  AssertionResult local_1198;
  key_type local_1184;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_1180;
  key_type local_112c;
  AssertHelper *local_1128;
  undefined4 local_111c;
  AssertionResult local_1118;
  string local_1108 [48];
  const_iterator local_10d8;
  key_type local_10b4;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_10b0;
  undefined1 local_1089;
  AssertionResult local_1088;
  string local_1078 [55];
  undefined1 local_1041;
  AssertionResult local_1040;
  key_type local_102c;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1028;
  key_type local_fd4;
  char *local_fd0;
  undefined4 local_fc4;
  AssertionResult local_fc0;
  string local_fb0 [48];
  iterator local_f80;
  key_type local_f5c;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_f58;
  undefined1 local_f31;
  AssertionResult local_f30;
  string local_f20 [55];
  undefined1 local_ee9;
  AssertionResult local_ee8;
  key_type local_ed4;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_ed0;
  key_type local_e7c;
  size_type local_e78;
  undefined4 local_e6c;
  AssertionResult local_e68;
  string local_e58 [48];
  const_iterator local_e28;
  key_type local_e04;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_e00;
  undefined1 local_dd9;
  AssertionResult local_dd8;
  string local_dc8 [55];
  undefined1 local_d91;
  AssertionResult local_d90;
  key_type local_d7c;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_d78;
  key_type local_d24;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_d20;
  undefined4 local_d14;
  AssertionResult local_d10;
  string local_d00 [48];
  iterator local_cd0;
  key_type local_cac;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_ca8;
  undefined1 local_c81;
  AssertionResult local_c80;
  string local_c70 [55];
  undefined1 local_c39;
  AssertionResult local_c38 [2];
  key_type local_c18;
  key_type local_c14;
  AssertionResult local_c10;
  string local_c00 [55];
  undefined1 local_bc9;
  AssertionResult local_bc8;
  key_type local_bb4;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_bb0;
  key_type local_b5c;
  size_type local_b58;
  undefined4 local_b4c;
  AssertionResult local_b48;
  string local_b38 [48];
  const_iterator local_b08;
  key_type local_ae4;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_ae0;
  undefined1 local_ab9;
  AssertionResult local_ab8;
  string local_aa8 [55];
  undefined1 local_a71;
  AssertionResult local_a70 [2];
  key_type local_a50;
  key_type local_a4c;
  AssertionResult local_a48;
  string local_a38 [55];
  undefined1 local_a01;
  AssertionResult local_a00;
  key_type local_9ec;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_9e8;
  key_type local_994;
  size_type local_990;
  undefined4 local_984;
  AssertionResult local_980;
  string local_970 [48];
  iterator local_940;
  key_type local_91c;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_918;
  undefined1 local_8f1;
  AssertionResult local_8f0;
  string local_8e0 [55];
  undefined1 local_8a9;
  AssertionResult local_8a8 [2];
  key_type local_888;
  key_type local_884;
  AssertionResult local_880;
  string local_870 [55];
  undefined1 local_839;
  AssertionResult local_838;
  key_type local_824;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_820;
  key_type local_7cc;
  size_type local_7c8;
  undefined4 local_7bc;
  AssertionResult local_7b8;
  string local_7a8 [48];
  const_iterator local_778;
  key_type local_754;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_750;
  undefined1 local_729;
  AssertionResult local_728;
  string local_718 [55];
  undefined1 local_6e1;
  AssertionResult local_6e0 [2];
  key_type local_6c0;
  key_type local_6bc;
  AssertionResult local_6b8;
  string local_6a8 [55];
  undefined1 local_671;
  AssertionResult local_670;
  key_type local_65c;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_658;
  key_type local_604;
  size_type local_600;
  undefined4 local_5f4;
  AssertionResult local_5f0;
  string local_5e0 [48];
  iterator local_5b0;
  key_type local_58c;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_588;
  undefined1 local_561;
  AssertionResult local_560 [10];
  key_type local_4c0;
  key_type local_4bc;
  AssertionResult local_4b8;
  key_type local_4a4;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_4a0;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_498;
  uint *local_490;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_488;
  size_type local_450;
  undefined4 local_444;
  AssertionResult local_440 [3];
  value_type local_408;
  value_type local_3d8;
  value_type local_3a8;
  value_type local_378;
  value_type local_348;
  value_type local_318;
  value_type local_2e8;
  value_type local_2b8;
  string local_2b0 [55];
  byte local_279;
  AssertionResult local_278 [3];
  value_type local_240;
  string local_238 [55];
  undefined1 local_201;
  AssertionResult local_200;
  key_type local_1ec;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1e8;
  key_type local_194;
  size_type local_190;
  undefined4 local_184;
  AssertionResult local_180;
  string local_170 [48];
  iterator local_140;
  key_type local_11c;
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_118;
  undefined1 local_f1;
  AssertionResult local_f0;
  string local_e0 [71];
  undefined1 local_99;
  AssertionResult local_98;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_88;
  undefined1 local_48 [72];
  
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)in_stack_ffffffffffffeb90);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)in_stack_ffffffffffffeb90);
  local_99 = google::
             BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd0667a);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb90,(bool *)in_stack_ffffffffffffeb88,
             (type *)0xd0669c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)in_stack_ffffffffffffeba0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb90);
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0xd0675d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd067f4);
  local_11c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeba0,(int)((ulong)in_stack_ffffffffffffeb98 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_f1 = google::
             dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(&local_118,&local_140);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb90,(bool *)in_stack_ffffffffffffeb88,
             (type *)0xd06889);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)in_stack_ffffffffffffeba0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb90);
    std::__cxx11::string::~string(local_170);
    testing::Message::~Message((Message *)0xd0695c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd069f3);
  local_184 = 0;
  local_194 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeba0,(int)((ulong)in_stack_ffffffffffffeb98 >> 0x20))
  ;
  local_190 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_ffffffffffffeb90,(key_type *)in_stack_ffffffffffffeb88);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),
             (char *)in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98,
             (unsigned_long *)in_stack_ffffffffffffeb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd06ab4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)in_stack_ffffffffffffeba0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb90);
    testing::Message::~Message((Message *)0xd06b17);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd06b88);
  local_1ec = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeba0,(int)((ulong)in_stack_ffffffffffffeb98 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_1e8);
  local_201 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb90,(bool *)in_stack_ffffffffffffeb88,
             (type *)0xd06c1d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)in_stack_ffffffffffffeba0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb90);
    std::__cxx11::string::~string(local_238);
    testing::Message::~Message((Message *)0xd06cf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd06d87);
  local_240 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xd06dde);
  local_279 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb90,(bool *)in_stack_ffffffffffffeb88,
             (type *)0xd06e02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)in_stack_ffffffffffffeba0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb90);
    std::__cxx11::string::~string(local_2b0);
    testing::Message::~Message((Message *)0xd06ed5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd06f6c);
  local_2b8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_2e8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_318 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_348 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_378 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_3a8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_3d8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_408 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb88,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
           (value_type *)in_stack_ffffffffffffec08);
  local_444 = 9;
  local_450 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd071b8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),
             (char *)in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98,
             (unsigned_long *)in_stack_ffffffffffffeb90);
  iVar6 = (int)((ulong)in_stack_ffffffffffffeb98 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd07231);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)in_stack_ffffffffffffeba0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb90);
    testing::Message::~Message((Message *)0xd07294);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd07305);
  local_4a4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeba0,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  it_00.super_iterator.pos._0_4_ = in_stack_ffffffffffffeba8;
  it_00.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_488;
  it_00.super_iterator.pos._4_4_ = in_stack_ffffffffffffebac;
  it_00.super_iterator.end._0_4_ = in_stack_ffffffffffffebb0;
  it_00.super_iterator.end._4_4_ = in_stack_ffffffffffffebb4;
  it_00.parent_._0_4_ = in_stack_ffffffffffffebb8;
  it_00.parent_._4_4_ = in_stack_ffffffffffffebbc;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator((const_iterator *)local_498,it_00);
  local_4bc = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd0738e);
  local_4c0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(local_488,(int)((ulong)local_490 >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)local_488
             ,(int *)local_490,(int *)local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
  success = local_4a0;
  this_02 = local_498;
  lhs = local_490;
  this_03 = local_488;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd0741f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)local_488);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
    testing::Message::~Message((Message *)0xd07482);
    success = local_4a0;
    this_02 = local_498;
    lhs = local_490;
    this_03 = local_488;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd074f3);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_02,success);
  local_58c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_561 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_588,&local_5b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd075ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_560);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_5e0);
    testing::Message::~Message((Message *)0xd0769a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd07731);
  local_5f4 = 1;
  local_604 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_600 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)success);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd07816);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd07879);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd078ea);
  local_65c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_658);
  local_671 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd07993);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_670);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_6a8);
    testing::Message::~Message((Message *)0xd07a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd07aff);
  local_6bc = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd07b0c);
  local_6c0 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             (int *)lhs,(int *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd07bbf);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd07c22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd07c90);
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_6e1 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd07cd4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_718);
    testing::Message::~Message((Message *)0xd07da9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd07e40);
  local_754 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_729 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_750,&local_778);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd07ed4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_728);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_7a8);
    testing::Message::~Message((Message *)0xd07fa9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd08040);
  local_7bc = 1;
  local_7cc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_7c8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)success);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd08116);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd08179);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd081ea);
  local_824 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_820);
  local_839 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd08284);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_838);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_870);
    testing::Message::~Message((Message *)0xd08359);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd083f0);
  local_884 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd083fd);
  local_888 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             (int *)lhs,(int *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_880);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd084b0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd08513);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd08581);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_8a9 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd085c5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_8e0);
    testing::Message::~Message((Message *)0xd0869a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd08731);
  local_91c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_8f1 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_918,&local_940);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd087d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_970);
    testing::Message::~Message((Message *)0xd088ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd08944);
  local_984 = 1;
  local_994 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_990 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)success);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_980);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd08a29);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd08a8c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd08afd);
  local_9ec = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_9e8);
  local_a01 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd08ba6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_a38);
    testing::Message::~Message((Message *)0xd08c7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd08d12);
  local_a4c = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd08d1f);
  local_a50 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             (int *)lhs,(int *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd08dd2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd08e35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd08ea3);
  google::
  dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_a71 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd08ee7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_aa8);
    testing::Message::~Message((Message *)0xd08fbc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09053);
  local_ae4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_ab9 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_ae0,&local_b08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd090e7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ab8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_b38);
    testing::Message::~Message((Message *)0xd091bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09253);
  local_b4c = 1;
  local_b5c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_b58 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)success);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd09329);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd0938c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd093fd);
  local_bb4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffec60,in_stack_ffffffffffffec58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_bb0);
  local_bc9 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd09497);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bc8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_c00);
    testing::Message::~Message((Message *)0xd0956c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09603);
  local_c14 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd09610);
  local_c18 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             (int *)lhs,(int *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd096c3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd09726);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09794);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_02);
  local_c39 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd097d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_c70);
    testing::Message::~Message((Message *)0xd098ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09944);
  local_cac = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_c81 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_ca8,&local_cd0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd099eb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_d00);
    testing::Message::~Message((Message *)0xd09ac0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09b57);
  local_d14 = 0;
  local_d24 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  this_00 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)google::
               BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_02,(key_type *)success);
  local_d20 = this_00;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    in_stack_ffffffffffffec58 =
         (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0xd09c3c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd09c9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09d10);
  local_d7c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,in_stack_ffffffffffffec58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)local_48,&local_d78);
  local_d91 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)local_48,(iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd09db9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_dc8);
    testing::Message::~Message((Message *)0xd09e8e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd09f25);
  local_e04 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_dd9 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_e00,&local_e28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd09fb9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_dd8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_e58);
    testing::Message::~Message((Message *)0xd0a08e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0a125);
  local_e6c = 0;
  local_e7c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_e78 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_02,(key_type *)success);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd0a1fb);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd0a25e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0a2cf);
  local_ed4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,in_stack_ffffffffffffec58);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_ed0);
  local_ee9 = google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd0a369);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ee8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffec08,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffec14,in_stack_ffffffffffffec10),
               (Message *)in_stack_ffffffffffffec08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_f20);
    testing::Message::~Message((Message *)0xd0a43e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0a4d5);
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_f5c = kVar2;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffebd0,
         (key_type *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffebd0);
  local_f31 = google::
              dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_f58,&local_f80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd0a57c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,
               (char *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
               in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar2,in_stack_ffffffffffffec10),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_fb0);
    testing::Message::~Message((Message *)0xd0a651);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0a6e8);
  local_fc4 = 0;
  actual_predicate_value = (char *)(in_RDI + 0x10);
  kVar3 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  local_fd4 = kVar3;
  expected_predicate_value =
       (char *)google::
               BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_02,(key_type *)success);
  local_fd0 = expected_predicate_value;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_fc0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::AssertionResult::failure_message((AssertionResult *)0xd0a7bb);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar2,in_stack_ffffffffffffec10),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd0a818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0a889);
  local_102c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,in_stack_ffffffffffffec58);
  this_05 = (BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_48;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
               *)this_05,&local_1028);
  local_1041 = google::
               dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_05,(iterator *)(local_48 + 0x20));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd0a920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1040);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT44(kVar3,in_stack_ffffffffffffec00),
               actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar2,in_stack_ffffffffffffec10),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1078);
    testing::Message::~Message((Message *)0xd0a9f5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0aa8c);
  local_10b4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(this_05,(key_type *)CONCAT44(local_10b4,in_stack_ffffffffffffebc8));
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_05);
  local_1089 = google::
               dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_10b0,&local_10d8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd0ab1a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1088);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffebc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT44(kVar3,in_stack_ffffffffffffec00),
               actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar2,in_stack_ffffffffffffec10),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_1108);
    testing::Message::~Message((Message *)0xd0abef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0ac86);
  local_111c = 0;
  local_112c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_03,(int)((ulong)lhs >> 0x20));
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(this_02,(key_type *)success);
  local_1128 = this_01;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffebac,in_stack_ffffffffffffeba8),(char *)this_03,
             lhs,(unsigned_long *)this_02);
  iVar6 = (int)((ulong)lhs >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1118);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0xd0ad50);
    in_stack_ffffffffffffebbc = (Type)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,in_stack_ffffffffffffebbc,
               (char *)CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
               in_stack_ffffffffffffebac,(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar2,in_stack_ffffffffffffec10),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    testing::Message::~Message((Message *)0xd0adad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0ae1e);
  kVar4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(this_03,iVar6);
  local_1184 = kVar4;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,in_stack_ffffffffffffec58);
  this_04 = &local_88;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(this_04,&local_1180);
  local_1199 = google::
               dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_04,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_02,(bool *)success,(type *)0xd0aeac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1198);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)CONCAT44(kVar3,in_stack_ffffffffffffec00),
               actual_predicate_value,expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,in_stack_ffffffffffffebbc,(char *)CONCAT44(kVar4,in_stack_ffffffffffffebb0),
               (int)((ulong)this_04 >> 0x20),(char *)this_03);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(kVar2,in_stack_ffffffffffffec10),(Message *)assertion_result
              );
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_02);
    std::__cxx11::string::~string(local_11d0);
    testing::Message::~Message((Message *)0xd0af81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd0b015);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xd0b022);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}